

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs5TestImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  RegexPattern *this;
  code *pcVar1;
  ScriptContext *pSVar2;
  uint i;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  Recycler *recycler;
  JavascriptLibrary *pJVar9;
  Var pvVar10;
  ulong uVar11;
  undefined8 extraout_RDX;
  undefined8 scriptContext_00;
  GroupInfo in_R8;
  uint offset;
  undefined4 uVar12;
  JavascriptString *cachedValue;
  undefined8 scriptContext_01;
  int iVar13;
  GroupInfo GVar14;
  JavascriptLibrary **addr;
  byte bVar15;
  undefined1 local_88 [24];
  ScriptContext *local_70;
  Type local_68;
  uint local_4c;
  ScriptContext *local_48;
  ulong local_40;
  bool local_32;
  bool local_31;
  
  this = (regularExpression->pattern).ptr;
  local_68.unified.trigramInfo.ptr = (Type)scriptContext;
  local_48 = (ScriptContext *)regularExpression;
  local_68.unified.program.ptr = (Type)JavascriptString::GetString(input);
  cVar7 = JavascriptString::GetLength(input);
  local_40 = CONCAT44(local_40._4_4_,cVar7);
  bVar3 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar4 = UnifiedRegex::RegexPattern::IsSticky(this);
  local_32 = bVar4;
  local_31 = bVar3;
  if (bVar3 || bVar4) {
    pJVar9 = (JavascriptLibrary *)0x0;
    local_4c = 0;
    cachedValue = (JavascriptString *)0x0;
    local_70 = (ScriptContext *)0x0;
  }
  else {
    UnifiedRegex::RegexPattern::EnsureTestCache((RegexPattern *)local_88);
    local_4c = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
    local_70 = (ScriptContext *)local_88._0_8_;
    if (*(_func_int **)(local_88._0_8_ + ((ulong)local_4c + 1) * 8) == (_func_int *)0x0) {
      cachedValue = (JavascriptString *)0x0;
    }
    else {
      cachedValue = *(JavascriptString **)
                     *(_func_int **)(local_88._0_8_ + ((ulong)local_4c + 1) * 8);
    }
    pJVar9 = (JavascriptLibrary *)CONCAT71(SUB87(local_88._0_8_,1),cachedValue == input);
  }
  RegexHelperTrace((ScriptContext *)local_68.unified.trigramInfo.ptr,Test,
                   (JavascriptRegExp *)local_48,input);
  scriptContext_00 = (ulong)pJVar9 & 0xff;
  local_88._8_8_ = cachedValue;
  local_88._16_8_ = pJVar9;
  UnifiedRegex::RegexPattern::TraceTestCache(SUB81(pJVar9,0),input,cachedValue,bVar3 || bVar4);
  uVar12 = (undefined4)CONCAT71((int7)((ulong)cachedValue >> 8),1);
  if (SUB81(pJVar9,0) != false) {
    if (bVar3 || bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2c2,"(useCache)","useCache");
      if (!bVar5) goto LAB_00d3ba55;
      *puVar8 = 0;
    }
    scriptContext_00 = local_70;
    BVar6 = BVStatic<8UL>::Test((BVStatic<8UL> *)local_70,local_4c);
    if (BVar6 != '\0') {
      scriptContext_00 =
           (((ScriptContextBase *)((long)local_68.unified.trigramInfo.ptr + 8))->javascriptLibrary->
           super_JavascriptLibraryBase).regexConstructor.ptr;
      JavascriptRegExpConstructor::InvalidateLastMatch
                ((JavascriptRegExpConstructor *)scriptContext_00,
                 (RegexPattern *)(local_48->super_ScriptContextBase).pActiveScriptDirect,input);
      uVar12 = 0;
    }
  }
  pSVar2 = local_48;
  offset = 0;
  local_68._12_4_ = uVar12;
  if (bVar3 || bVar4) {
    offset = *(uint *)&((Type *)&local_48->prev)->ptr;
    if (offset == 0xfffffffe) {
      scriptContext_00 = local_48;
      JavascriptRegExp::CacheLastIndex((JavascriptRegExp *)local_48);
      offset = *(uint *)&((Type *)&pSVar2->prev)->ptr;
    }
    if (0x7ffffffe < offset) {
      local_48->next = (ScriptContext *)0x0;
      *(undefined4 *)&((Type *)&local_48->prev)->ptr = 0;
      return (((ScriptContextBase *)((long)local_68.unified.trigramInfo.ptr + 8))->javascriptLibrary
             ->super_JavascriptLibraryBase).booleanFalse.ptr;
    }
    if (offset <= (uint)local_40) goto LAB_00d3b7db;
    local_40 = 0xffffffff;
    local_68.unified.program.ptr = (Type)(Program *)0x0;
    uVar11 = 0;
    scriptContext_01 = local_68.unified.trigramInfo.ptr;
  }
  else {
LAB_00d3b7db:
    scriptContext_01 = local_68.unified.trigramInfo.ptr;
    in_R8.length = 0;
    in_R8.offset = offset;
    scriptContext_00 = local_68.unified.trigramInfo.ptr;
    GVar14 = SimpleMatch((ScriptContext *)local_68.unified.trigramInfo.ptr,this,
                         (char16 *)local_68.unified.program.ptr,(uint)local_40,offset);
    uVar11 = (ulong)GVar14 & 0xffffffff;
    local_40 = (ulong)GVar14 >> 0x20;
    local_68._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
    local_68._0_1_ = offset == 0;
  }
  pSVar2 = local_48;
  GVar14 = (GroupInfo)(local_40 << 0x20 | uVar11);
  PropagateLastMatchToRegex
            ((ScriptContext *)scriptContext_00,local_31,local_32,(JavascriptRegExp *)local_48,in_R8,
             GVar14);
  uVar11 = local_40;
  PropagateLastMatchToCtor
            ((ScriptContext *)scriptContext_01,(JavascriptRegExp *)pSVar2,input,GVar14,false);
  i = local_4c;
  uVar12 = local_68._12_4_;
  pSVar2 = local_70;
  iVar13 = (int)uVar11;
  bVar15 = iVar13 != -1;
  if (!bVar3 && !bVar4) {
    local_31 = (bool)bVar15;
    if (local_68._0_1_ == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2ea,"(offset == 0)","offset == 0");
      if (!bVar3) goto LAB_00d3ba55;
      *puVar8 = 0;
      iVar13 = (int)local_40;
    }
    if ((char)local_88._16_8_ == '\x01' && (JavascriptString *)local_88._8_8_ != input) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2eb,"(!cacheHit || cachedInput == input)",
                                  "!cacheHit || cachedInput == input");
      if (!bVar3) goto LAB_00d3ba55;
      *puVar8 = 0;
      iVar13 = (int)local_40;
    }
    if ((byte)((byte)local_88._16_8_ & ((byte)uVar12 ^ iVar13 == -1)) == 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x2ec,"(!cacheHit || cachedResult == wasFound)",
                                  "!cacheHit || cachedResult == wasFound");
      if (!bVar3) {
LAB_00d3ba55:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    recycler = RecyclableObject::GetRecycler((RecyclableObject *)local_48);
    pJVar9 = (JavascriptLibrary *)
             Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)input,recycler);
    if ((pJVar9->super_JavascriptLibraryBase).weakMapConstructor.ptr == (RuntimeFunction *)0x0) {
      (pJVar9->super_JavascriptLibraryBase).weakMapConstructor.ptr =
           (RuntimeFunction *)&JavascriptString::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,(RecyclerWeakReferenceBase *)pJVar9);
    }
    addr = &(pSVar2->super_ScriptContextBase).javascriptLibrary + i;
    Memory::Recycler::WBSetBit((char *)addr);
    *addr = pJVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((uint)local_40 == -1) {
      BVStatic<8UL>::Clear((BVStatic<8UL> *)pSVar2,i);
      bVar15 = local_31;
    }
    else {
      BVStatic<8UL>::Set((BVStatic<8UL> *)pSVar2,i);
      bVar15 = local_31;
    }
  }
  pvVar10 = JavascriptBoolean::ToVar((uint)bVar15,(ScriptContext *)local_68.unified.trigramInfo.ptr)
  ;
  return pvVar10;
}

Assistant:

Var RegexHelper::RegexEs5TestImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        UnifiedRegex::GroupInfo match; // initially undefined

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        const bool useCache = !isGlobal && !isSticky;

        UnifiedRegex::RegExpTestCache* cache = nullptr;
        JavascriptString * cachedInput = nullptr;
        uint cacheIndex = 0;
        bool cacheHit = false;
        bool cachedResult = false;
        if (useCache)
        {
            cache = pattern->EnsureTestCache();
            cacheIndex = UnifiedRegex::RegexPattern::GetTestCacheIndex(input);
            cachedInput = cache->inputArray[cacheIndex] != nullptr ? cache->inputArray[cacheIndex]->Get() : nullptr;
            cacheHit = cachedInput == input;
        }
#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Test, regularExpression, input);
        UnifiedRegex::RegexPattern::TraceTestCache(cacheHit, input, cachedInput, !useCache);
#endif

        if (cacheHit)
        {
            Assert(useCache);
            cachedResult = (cache->resultBV.Test(cacheIndex) != 0);

            // If our cache says this test should produce a match (which we aren't going to compute),
            // notify the Ctor to invalidate the last match so it must be recomputed before access.
            if (cachedResult)
            {
                InvalidateLastMatchOnCtor(scriptContext, regularExpression, input);
            }

            // for debug builds, let's still do the real test so we can validate values in the cache
#if !DBG
            return JavascriptBoolean::ToVar(cachedResult, scriptContext);
#endif
        }

        CharCount offset;
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            if (useCache)
            {
                Assert(offset == 0);
                Assert(!cacheHit || cachedInput == input);
                Assert(!cacheHit || cachedResult == false);
                cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
                cache->resultBV.Clear(cacheIndex);
            }
            return scriptContext->GetLibrary()->GetFalse();
        }
        if (offset <= inputLength)
        {
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);
        bool wasFound = !match.IsUndefined();

        if (useCache)
        {
            Assert(offset == 0);
            Assert(!cacheHit || cachedInput == input);
            Assert(!cacheHit || cachedResult == wasFound);
            cache->inputArray[cacheIndex] = regularExpression->GetRecycler()->CreateWeakReferenceHandle(input);
            if (wasFound)
            {
                cache->resultBV.Set(cacheIndex);
            }
            else
            {
                cache->resultBV.Clear(cacheIndex);
            }
        }
        return JavascriptBoolean::ToVar(wasFound, scriptContext);
    }